

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O3

void __thiscall
Linker::CollectDebugInfo(Linker *this,FastVector<unsigned_char_*,_false,_false> *instAddress)

{
  uint *puVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint *puVar6;
  uint newSize;
  
  if (instAddress == (FastVector<unsigned_char_*,_false,_false> *)0x0) {
    uVar5 = 4;
  }
  else {
    uVar5 = (ulong)(instAddress->count * 8 + 4);
  }
  nullcModuleBytecodeSize =
       (ulong)((this->exRegVmConstants).count << 2) +
       (ulong)((this->exRegVmSourceInfo).count * 0xc) +
       (ulong)((this->exRegVmCode).count << 3) +
       (ulong)(this->exMainModuleName).count + (ulong)(this->exImportPaths).count +
       (ulong)(this->exSource).count +
       (ulong)(this->exSymbols).count +
       (ulong)((this->exModules).count * 0x1c) + (ulong)((this->exLocals).count * 0x1c) +
       (ulong)((this->exFunctionExplicitTypes).count << 2) +
       (ulong)((this->exFunctionExplicitTypeArrayOffsets).count << 2) +
       (ulong)((this->exFunctions).count * 0x94) +
       (ulong)((this->exVariables).count << 4) +
       (ulong)((this->exTypeConstants).count * 0xc) +
       (ulong)((this->exTypeExtra).count * 0xc) + (ulong)((this->exTypes).count * 0x50 + 4) + 0x40 +
       uVar5;
  newSize = (uint)nullcModuleBytecodeSize;
  if ((this->fullLinkerData).max <= newSize) {
    puVar2 = (this->fullLinkerData).data;
    FastVector<unsigned_char,_false,_false>::grow_no_destroy(&this->fullLinkerData,newSize);
    if (puVar2 != (uchar *)0x0) {
      (*(code *)NULLC::dealloc)(puVar2);
    }
  }
  (this->fullLinkerData).count = newSize;
  puVar6 = (uint *)(this->fullLinkerData).data;
  *puVar6 = (this->exTypes).count;
  memcpy(puVar6 + 1,(this->exTypes).data,(ulong)(this->exTypes).count * 0x50);
  uVar5 = (ulong)((this->exTypes).count * 0x50);
  lVar3 = uVar5 + 4;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 8);
  *(uint *)(puVar2 + -4) = (this->exTypeExtra).count;
  memcpy(puVar2,(this->exTypeExtra).data,(ulong)(this->exTypeExtra).count * 0xc);
  uVar5 = (ulong)((this->exTypeExtra).count * 0xc + 4);
  lVar4 = uVar5 + lVar3;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 4 + lVar3);
  *(uint *)(puVar2 + -4) = (this->exTypeConstants).count;
  memcpy(puVar2,(this->exTypeConstants).data,(ulong)(this->exTypeConstants).count * 0xc);
  uVar5 = (ulong)((this->exTypeConstants).count * 0xc + 4);
  lVar3 = uVar5 + lVar4;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 4 + lVar4);
  *(uint *)(puVar2 + -4) = (this->exVariables).count;
  memcpy(puVar2,(this->exVariables).data,(ulong)(this->exVariables).count << 4);
  uVar5 = (ulong)((this->exVariables).count << 4);
  lVar4 = uVar5 + lVar3 + 4;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 8 + lVar3);
  *(uint *)(puVar2 + -4) = (this->exFunctions).count;
  memcpy(puVar2,(this->exFunctions).data,(ulong)(this->exFunctions).count * 0x94);
  uVar5 = (ulong)((this->exFunctions).count * 0x94 + 4);
  lVar3 = uVar5 + lVar4;
  puVar1 = (uint *)((long)puVar6 + uVar5 + lVar4);
  *puVar1 = (this->exFunctionExplicitTypeArrayOffsets).count;
  memcpy(puVar1 + 1,(this->exFunctionExplicitTypeArrayOffsets).data,
         (ulong)(this->exFunctionExplicitTypeArrayOffsets).count << 2);
  uVar5 = (ulong)((this->exFunctionExplicitTypeArrayOffsets).count * 4 + 4);
  lVar4 = uVar5 + lVar3;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 4 + lVar3);
  *(uint *)(puVar2 + -4) = (this->exFunctionExplicitTypes).count;
  memcpy(puVar2,(this->exFunctionExplicitTypes).data,
         (ulong)(this->exFunctionExplicitTypes).count << 2);
  uVar5 = (ulong)((this->exFunctionExplicitTypes).count * 4 + 4);
  lVar3 = uVar5 + lVar4;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 4 + lVar4);
  *(uint *)(puVar2 + -4) = (this->exLocals).count;
  memcpy(puVar2,(this->exLocals).data,(ulong)(this->exLocals).count * 0x1c);
  uVar5 = (ulong)((this->exLocals).count * 0x1c + 4);
  lVar4 = uVar5 + lVar3;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 4 + lVar3);
  *(uint *)(puVar2 + -4) = (this->exModules).count;
  memcpy(puVar2,(this->exModules).data,(ulong)(this->exModules).count * 0x1c);
  uVar5 = (ulong)((this->exModules).count * 0x1c + 4);
  lVar3 = uVar5 + lVar4;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 4 + lVar4);
  *(uint *)(puVar2 + -4) = (this->exSymbols).count;
  memcpy(puVar2,(this->exSymbols).data,(ulong)(this->exSymbols).count);
  uVar5 = (ulong)((this->exSymbols).count + 4);
  lVar4 = uVar5 + lVar3;
  puVar1 = (uint *)((long)puVar6 + uVar5 + lVar3);
  *puVar1 = (this->exSource).count;
  memcpy(puVar1 + 1,(this->exSource).data,(ulong)(this->exSource).count);
  uVar5 = (ulong)((this->exSource).count + 4);
  lVar3 = uVar5 + lVar4;
  puVar1 = (uint *)((long)puVar6 + uVar5 + lVar4);
  *puVar1 = (this->exImportPaths).count;
  memcpy(puVar1 + 1,(this->exImportPaths).data,(ulong)(this->exImportPaths).count);
  uVar5 = (ulong)((this->exImportPaths).count + 4);
  lVar4 = uVar5 + lVar3;
  puVar1 = (uint *)((long)puVar6 + uVar5 + lVar3);
  *puVar1 = (this->exMainModuleName).count;
  memcpy(puVar1 + 1,(this->exMainModuleName).data,(ulong)(this->exMainModuleName).count);
  uVar5 = (ulong)((this->exMainModuleName).count + 4);
  lVar3 = uVar5 + lVar4;
  puVar1 = (uint *)((long)puVar6 + uVar5 + lVar4);
  *puVar1 = (this->exRegVmCode).count;
  memcpy(puVar1 + 1,(this->exRegVmCode).data,(ulong)(this->exRegVmCode).count << 3);
  uVar5 = (ulong)((this->exRegVmCode).count << 3);
  lVar4 = uVar5 + lVar3 + 4;
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 8 + lVar3);
  *(uint *)(puVar2 + -4) = (this->exRegVmSourceInfo).count;
  memcpy(puVar2,(this->exRegVmSourceInfo).data,(ulong)(this->exRegVmSourceInfo).count * 0xc);
  uVar5 = (ulong)((this->exRegVmSourceInfo).count * 0xc + 4);
  puVar2 = (uchar *)((long)puVar6 + uVar5 + 4 + lVar4);
  *(uint *)(puVar2 + -4) = (this->exRegVmConstants).count;
  memcpy(puVar2,(this->exRegVmConstants).data,(ulong)(this->exRegVmConstants).count << 2);
  puVar6 = (uint *)((long)puVar6 + ((this->exRegVmConstants).count * 4 + 4) + uVar5 + lVar4);
  if (instAddress == (FastVector<unsigned_char_*,_false,_false> *)0x0) {
    *puVar6 = 0;
    uVar5 = 4;
  }
  else {
    *puVar6 = instAddress->count;
    memcpy(puVar6 + 1,instAddress->data,(ulong)instAddress->count << 3);
    uVar5 = (ulong)(instAddress->count * 8 + 4);
  }
  *(uint *)((long)puVar6 + uVar5) = this->globalVarSize;
  nullcModuleBytecodeLocation = (uintptr_t)(this->fullLinkerData).data;
  nullcModuleBytecodeVersion = nullcModuleBytecodeVersion + 1;
  return;
}

Assistant:

void Linker::CollectDebugInfo(FastVector<unsigned char*> *instAddress)
{
	nullcModuleBytecodeSize = 0;

	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypes);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypeExtra);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypeConstants);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exVariables);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctions);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctionExplicitTypeArrayOffsets);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctionExplicitTypes);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exLocals);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exModules);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exSymbols);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exSource);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exImportPaths);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exMainModuleName);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmCode);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmSourceInfo);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmConstants);

	if(instAddress)
		nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(*instAddress);
	else
		nullcModuleBytecodeSize += sizeof(unsigned);

	nullcModuleBytecodeSize += sizeof(unsigned); // exLinker->globalVarSize

	fullLinkerData.resize((unsigned)nullcModuleBytecodeSize);

	unsigned char *pos = fullLinkerData.data;

	pos += NULLC::WriteArraySizeAndData(pos, exTypes);
	pos += NULLC::WriteArraySizeAndData(pos, exTypeExtra);
	pos += NULLC::WriteArraySizeAndData(pos, exTypeConstants);
	pos += NULLC::WriteArraySizeAndData(pos, exVariables);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctions);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctionExplicitTypeArrayOffsets);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctionExplicitTypes);
	pos += NULLC::WriteArraySizeAndData(pos, exLocals);
	pos += NULLC::WriteArraySizeAndData(pos, exModules);
	pos += NULLC::WriteArraySizeAndData(pos, exSymbols);
	pos += NULLC::WriteArraySizeAndData(pos, exSource);
	pos += NULLC::WriteArraySizeAndData(pos, exImportPaths);
	pos += NULLC::WriteArraySizeAndData(pos, exMainModuleName);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmCode);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmSourceInfo);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmConstants);

	if(instAddress)
	{
		pos += NULLC::WriteArraySizeAndData(pos, *instAddress);
	}
	else
	{
		unsigned zero = 0;
		memcpy(pos, &zero, sizeof(zero));
		pos += sizeof(zero);
	}


	memcpy(pos, &globalVarSize, sizeof(globalVarSize));
	pos += sizeof(globalVarSize);

	nullcModuleBytecodeLocation = uintptr_t(fullLinkerData.data);

	nullcModuleBytecodeVersion += 1;
}